

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Label.cpp
# Opt level: O1

void __thiscall entities::Label::Label(Label *this,Chunk *chunk,uint tileIndex)

{
  int iVar1;
  ResourceBase *pRVar2;
  undefined4 extraout_var;
  logger *this_00;
  LodRenderer *pLVar3;
  repr coords;
  locale local_a0 [8];
  undefined8 *local_98;
  long lStack_90;
  undefined8 local_88 [3];
  path local_70;
  String local_50;
  
  Entity::Entity(&this->super_Entity,chunk,tileIndex);
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR__Label_0027b250;
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Label_0027b288;
  std::locale::locale(local_a0);
  sf::String::String(&local_50,"",local_a0);
  pRVar2 = Locator::getResource();
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"resources/consolas.ttf","");
  local_70._path._M_dataplus._M_p = (pointer)&local_70._path.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_70,local_98,lStack_90 + (long)local_98);
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  ghc::filesystem::path::postprocess_path_with_format(&local_70,auto_format);
  iVar1 = (*pRVar2->_vptr_ResourceBase[3])(pRVar2,&local_70);
  sf::Text::Text(&this->text_,&local_50,(Font *)CONCAT44(extraout_var,iVar1),0x1e);
  ghc::filesystem::path::~path(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_50.m_string._M_dataplus._M_p != &local_50.m_string.field_2) {
    operator_delete(local_50.m_string._M_dataplus._M_p);
  }
  std::locale::~locale(local_a0);
  this_00 = spdlog::default_logger_raw();
  local_98 = (undefined8 *)0x0;
  lStack_90 = 0;
  local_88[0] = 0;
  spdlog::logger::log(this_00,0.0);
  pLVar3 = Chunk::getLodRenderer(chunk);
  if (pLVar3 != (LodRenderer *)0x0) {
    pLVar3 = Chunk::getLodRenderer(chunk);
    coords = Chunk::getCoords(chunk);
    LodRenderer::addDecoration(pLVar3,coords,tileIndex,&this->super_Drawable);
  }
  return;
}

Assistant:

Label::Label(Chunk& chunk, unsigned int tileIndex) :
    Entity(chunk, tileIndex),
    text_("", Locator::getResource()->getFont("resources/consolas.ttf"), 30) {

    spdlog::debug("Label entity has been created.");
    if (chunk.getLodRenderer() != nullptr) {
        chunk.getLodRenderer()->addDecoration(chunk.getCoords(), tileIndex, this);
    }
}